

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::Parser(Parser *this,Callbacks *cb,ParserOptions opts)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  undefined4 in_EDX;
  undefined4 *in_RDI;
  size_t in_stack_fffffffffffffeb8;
  State *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  Location *in_stack_fffffffffffffed0;
  Callbacks *in_stack_fffffffffffffed8;
  stack<c4::yml::Parser::State,_16UL> *in_stack_fffffffffffffee0;
  char (*in_stack_ffffffffffffff10) [25];
  State *in_stack_ffffffffffffff18;
  stack<c4::yml::Parser::State,_16UL> *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff28 [32];
  
  *in_RDI = in_EDX;
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)(in_RDI + 2));
  basic_substring<char>::basic_substring((basic_substring<char> *)(in_RDI + 6));
  *(undefined8 *)(in_RDI + 10) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  detail::stack<c4::yml::Parser::State,_16UL>::stack
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  *(undefined8 *)(in_RDI + 0x27c) = 0;
  *(undefined8 *)(in_RDI + 0x27e) = 0;
  *(undefined8 *)(in_RDI + 0x280) = 0;
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)(in_RDI + 0x282));
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)(in_RDI + 0x286));
  *(undefined8 *)(in_RDI + 0x28a) = 0;
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)(in_RDI + 0x28c));
  *(undefined1 *)(in_RDI + 0x290) = 0;
  *(undefined8 *)(in_RDI + 0x292) = 0;
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)(in_RDI + 0x294));
  *(undefined8 *)(in_RDI + 0x298) = 0;
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)(in_RDI + 0x29a));
  basic_substring<char>::basic_substring((basic_substring<char> *)(in_RDI + 0x29e));
  *(undefined8 *)(in_RDI + 0x2a2) = 0;
  *(undefined8 *)(in_RDI + 0x2a4) = 0;
  *(undefined8 *)(in_RDI + 0x2a6) = 0;
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)(in_RDI + 0x2a8));
  State::State(in_stack_fffffffffffffec0);
  detail::stack<c4::yml::Parser::State,_16UL>::push
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (*(long *)(in_RDI + 0x270) == 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                       (size_t)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    loc.super_LineCol.line = in_stack_ffffffffffffff28._0_8_;
    loc.super_LineCol.col = in_stack_ffffffffffffff28._8_8_;
    loc.name.str = (char *)SUB168(in_stack_ffffffffffffff28._16_16_,0);
    loc.name.len = SUB168(in_stack_ffffffffffffff28._16_16_,8);
    loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff20;
    error<25ul>(in_stack_ffffffffffffff10,loc);
  }
  *(long *)(in_RDI + 0x27c) = *(long *)(in_RDI + 0x26e) + (*(long *)(in_RDI + 0x270) + -1) * 0x98;
  return;
}

Assistant:

Parser::Parser(Callbacks const& cb, ParserOptions opts)
    : m_options(opts)
    , m_file()
    , m_buf()
    , m_root_id(NONE)
    , m_tree()
    , m_stack(cb)
    , m_state()
    , m_key_tag_indentation(0)
    , m_key_tag2_indentation(0)
    , m_key_tag()
    , m_key_tag2()
    , m_val_tag_indentation(0)
    , m_val_tag()
    , m_key_anchor_was_before(false)
    , m_key_anchor_indentation(0)
    , m_key_anchor()
    , m_val_anchor_indentation(0)
    , m_val_anchor()
    , m_filter_arena()
    , m_newline_offsets()
    , m_newline_offsets_size(0)
    , m_newline_offsets_capacity(0)
    , m_newline_offsets_buf()
{
    m_stack.push(State{});
    m_state = &m_stack.top();
}